

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ransac.c
# Opt level: O1

void score_affine(double *mat,Correspondence *points,int num_points,RANSAC_MOTION *model)

{
  int iVar1;
  ulong uVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  model->num_inliers = 0;
  model->sse = 0.0;
  if (0 < num_points) {
    pdVar3 = &points->ry;
    uVar2 = 0;
    do {
      dVar4 = (mat[2] * ((Correspondence *)(pdVar3 + -3))->x + mat[3] * pdVar3[-2] + *mat) -
              pdVar3[-1];
      dVar5 = (((Correspondence *)(pdVar3 + -3))->x * mat[4] + pdVar3[-2] * mat[5] + mat[1]) -
              *pdVar3;
      dVar4 = dVar4 * dVar4 + dVar5 * dVar5;
      if (dVar4 < 1.5625) {
        iVar1 = model->num_inliers;
        model->num_inliers = iVar1 + 1;
        model->inlier_indices[iVar1] = (int)uVar2;
        model->sse = dVar4 + model->sse;
      }
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + 4;
    } while ((uint)num_points != uVar2);
  }
  return;
}

Assistant:

static void score_affine(const double *mat, const Correspondence *points,
                         int num_points, RANSAC_MOTION *model) {
  model->num_inliers = 0;
  model->sse = 0.0;

  for (int i = 0; i < num_points; ++i) {
    const double x1 = points[i].x;
    const double y1 = points[i].y;
    const double x2 = points[i].rx;
    const double y2 = points[i].ry;

    const double proj_x = mat[2] * x1 + mat[3] * y1 + mat[0];
    const double proj_y = mat[4] * x1 + mat[5] * y1 + mat[1];

    const double dx = proj_x - x2;
    const double dy = proj_y - y2;
    const double sse = dx * dx + dy * dy;

    if (sse < INLIER_THRESHOLD_SQUARED) {
      model->inlier_indices[model->num_inliers++] = i;
      model->sse += sse;
    }
  }
}